

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

uchar * pull_skip(uchar **cursor,size_t *max,size_t len)

{
  uchar *p;
  size_t len_local;
  size_t *max_local;
  uchar **cursor_local;
  
  if (*cursor == (uchar *)0x0) {
    cursor_local = (uchar **)0x0;
  }
  else if (*max < len) {
    pull_failed(cursor,max);
    cursor_local = (uchar **)0x0;
  }
  else {
    cursor_local = (uchar **)*cursor;
    *cursor = *cursor + len;
    *max = *max - len;
  }
  return (uchar *)cursor_local;
}

Assistant:

const unsigned char *pull_skip(const unsigned char **cursor, size_t *max,
                               size_t len)
{
    const unsigned char *p;

    if (*cursor == NULL) {
        return NULL;
    }

    if (len > *max) {
        pull_failed(cursor, max);
        return NULL;
    }

    p = *cursor;
    *cursor += len;
    *max -= len;
    return p;
}